

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

void __thiscall diy::Master::~Master(Master *this)

{
  set_immediate(this,true);
  clear(this);
  if (this->queue_policy_ != (QueuePolicy *)0x0) {
    (*this->queue_policy_->_vptr_QueuePolicy[3])();
  }
  stats::DurationAccumulator::~DurationAccumulator(&(this->prof).total);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->log).super___shared_ptr<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::
  vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ::~vector(&this->commands_);
  Catch::clara::std::
  unique_ptr<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>::
  ~unique_ptr(&this->collectives_);
  Catch::clara::std::
  unique_ptr<diy::Master::InFlightRecvsMap,_std::default_delete<diy::Master::InFlightRecvsMap>_>::
  ~unique_ptr(&this->inflight_recvs_);
  Catch::clara::std::
  unique_ptr<diy::Master::InFlightSendsList,_std::default_delete<diy::Master::InFlightSendsList>_>::
  ~unique_ptr(&this->inflight_sends_);
  Catch::clara::std::
  _Rb_tree<int,_std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>,_std::_Select1st<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
  ::~_Rb_tree(&(this->outgoing_)._M_t);
  Catch::clara::std::
  _Rb_tree<int,_std::pair<const_int,_diy::Master::IncomingRound>,_std::_Select1st<std::pair<const_int,_diy::Master::IncomingRound>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
  ::~_Rb_tree(&(this->incoming_)._M_t);
  mpi::communicator::~communicator(&this->comm_);
  Catch::clara::std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->lids_)._M_t);
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->gids_).super__Vector_base<int,_std::allocator<int>_>);
  Collection::~Collection(&this->blocks_);
  Catch::clara::std::_Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>::~_Vector_base
            ((_Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_> *)this);
  return;
}

Assistant:

diy::Master::
~Master()
{
    set_immediate(true);
    clear();
    delete queue_policy_;
}